

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void read_level(level_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  double dVar2;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  level_t *record_local;
  
  init_level(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"level_id");
    if (iVar1 == 0) {
      strcpy(record->id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"level_index");
      if (iVar1 == 0) {
        dVar2 = strtod(field_values[local_2c],(char **)0x0);
        record->index = dVar2;
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"level_name");
        if (iVar1 == 0) {
          strcpy(record->name,field_values[local_2c]);
        }
      }
    }
  }
  return;
}

Assistant:

void read_level(level_t *record, int field_count, const char **field_names, const char **field_values) {
    init_level(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "level_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "level_index") == 0) {
            record->index = strtod(field_values[i], NULL);
            continue;
        }
        if (strcmp(field_names[i], "level_name") == 0) {
            strcpy(record->name, field_values[i]);
            continue;
        }
    }
}